

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,true,false>
               (unsigned_short *ldata,unsigned_short *rdata,unsigned_short *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong row_idx;
  unsigned_long *puVar1;
  ulong uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t i;
  ulong row_idx_00;
  idx_t row_idx_01;
  ulong uVar6;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (row_idx_01 = 0; count != row_idx_01; row_idx_01 = row_idx_01 + 1) {
      uVar3 = *ldata;
      if (rdata[row_idx_01] == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
      }
      else {
        uVar3 = uVar3 / rdata[row_idx_01];
      }
      result_data[row_idx_01] = uVar3;
    }
  }
  else {
    row_idx_00 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = row_idx_00 + 0x40;
        if (count <= row_idx_00 + 0x40) {
          uVar5 = count;
        }
LAB_0151485e:
        for (; row_idx = row_idx_00, row_idx_00 < uVar5; row_idx_00 = row_idx_00 + 1) {
          uVar3 = *ldata;
          if (rdata[row_idx_00] == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
          }
          else {
            uVar3 = uVar3 / rdata[row_idx_00];
          }
          result_data[row_idx_00] = uVar3;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar5 = row_idx_00 + 0x40;
        if (count <= row_idx_00 + 0x40) {
          uVar5 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0151485e;
        row_idx = uVar5;
        if (uVar2 != 0) {
          for (uVar6 = 0; row_idx = uVar6 + row_idx_00, row_idx < uVar5; uVar6 = uVar6 + 1) {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              uVar3 = *ldata;
              if (rdata[row_idx_00 + uVar6] == 0) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
              }
              else {
                uVar3 = uVar3 / rdata[row_idx_00 + uVar6];
              }
              result_data[row_idx_00 + uVar6] = uVar3;
            }
          }
        }
      }
      row_idx_00 = row_idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}